

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion_tests.cpp
# Opt level: O0

void skiwi::anon_unknown_31::linear_scan_tests_naive(void)

{
  Program *this;
  iterator __first;
  iterator __last;
  reference pvVar1;
  Let *pLVar2;
  reference pvVar3;
  Program local_288;
  token *local_228;
  __normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
  local_220;
  allocator<char> local_211;
  string local_210 [32];
  vector<skiwi::token,_std::allocator<skiwi::token>_> local_1f0;
  undefined1 local_1d8 [8];
  Let l;
  Program prog;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  compiler_options ops;
  
  skiwi::compiler_options::compiler_options
            ((compiler_options *)
             &tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"(let ([x 5]) x)",&local_69);
  skiwi::tokenize((string *)local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  __first = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::begin
                      ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_48);
  __last = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::end
                     ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_48);
  std::
  reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            ((__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )__first._M_current,
             (__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )__last._M_current);
  skiwi::make_program((vector *)(l.filename.field_2._M_local_buf + 8));
  skiwi::compute_linear_scan_index((Program *)((long)&l.filename.field_2 + 8));
  skiwi::linear_scan((Program *)((long)&l.filename.field_2 + 8),lsa_naive,
                     (compiler_options *)
                     &tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  pvVar1 = std::
           vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
           ::front((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                    *)((long)&l.filename.field_2 + 8));
  pLVar2 = std::
           get<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     (pvVar1);
  Let::Let((Let *)local_1d8,pLVar2);
  pvVar3 = std::vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_>::front
                     ((vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_> *)
                      &l.scan_index);
  TestEq<int,unsigned_long>
            (2,pvVar3->first,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/conversion_tests.cpp"
             ,0x212,"void skiwi::(anonymous namespace)::linear_scan_tests_naive()");
  pvVar3 = std::vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_>::front
                     ((vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_> *)
                      &l.scan_index);
  TestEq<int,unsigned_long>
            (4,pvVar3->last,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/conversion_tests.cpp"
             ,0x213,"void skiwi::(anonymous namespace)::linear_scan_tests_naive()");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_210,"(let ([x 5][y 6]) x)",&local_211);
  skiwi::tokenize((string *)&local_1f0);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::operator=
            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_48,&local_1f0);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(&local_1f0);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  local_220._M_current =
       (token *)std::vector<skiwi::token,_std::allocator<skiwi::token>_>::begin
                          ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_48);
  local_228 = (token *)std::vector<skiwi::token,_std::allocator<skiwi::token>_>::end
                                 ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_48);
  std::
  reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            (local_220,
             (__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )local_228);
  skiwi::make_program((vector *)&local_288);
  this = (Program *)((long)&l.filename.field_2 + 8);
  Program::operator=(this,&local_288);
  Program::~Program(&local_288);
  skiwi::compute_linear_scan_index(this);
  skiwi::linear_scan((Program *)((long)&l.filename.field_2 + 8),lsa_naive,
                     (compiler_options *)
                     &tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  pvVar1 = std::
           vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
           ::front((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                    *)((long)&l.filename.field_2 + 8));
  pLVar2 = std::
           get<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     (pvVar1);
  Let::operator=((Let *)local_1d8,pLVar2);
  pvVar3 = std::vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_>::front
                     ((vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_> *)
                      &l.scan_index);
  TestEq<int,unsigned_long>
            (2,pvVar3->first,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/conversion_tests.cpp"
             ,0x21b,"void skiwi::(anonymous namespace)::linear_scan_tests_naive()");
  pvVar3 = std::vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_>::front
                     ((vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_> *)
                      &l.scan_index);
  TestEq<int,unsigned_long>
            (5,pvVar3->last,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/conversion_tests.cpp"
             ,0x21c,"void skiwi::(anonymous namespace)::linear_scan_tests_naive()");
  pvVar3 = std::vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_>::back
                     ((vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_> *)
                      &l.scan_index);
  TestEq<int,unsigned_long>
            (3,pvVar3->first,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/conversion_tests.cpp"
             ,0x21d,"void skiwi::(anonymous namespace)::linear_scan_tests_naive()");
  pvVar3 = std::vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_>::back
                     ((vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_> *)
                      &l.scan_index);
  TestEq<int,unsigned_long>
            (5,pvVar3->last,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/conversion_tests.cpp"
             ,0x21e,"void skiwi::(anonymous namespace)::linear_scan_tests_naive()");
  Let::~Let((Let *)local_1d8);
  Program::~Program((Program *)((long)&l.filename.field_2 + 8));
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector
            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_48);
  return;
}

Assistant:

void linear_scan_tests_naive()
    {
    compiler_options ops;
    ops.parallel = false;
    auto tokens = tokenize("(let ([x 5]) x)");
    std::reverse(tokens.begin(), tokens.end());
    auto prog = make_program(tokens);
    compute_linear_scan_index(prog);
    linear_scan(prog, lsa_naive, ops);
    Let l = std::get<Let>(prog.expressions.front());
    TEST_EQ(2, l.live_ranges.front().first);
    TEST_EQ(4, l.live_ranges.front().last);

    tokens = tokenize("(let ([x 5][y 6]) x)");
    std::reverse(tokens.begin(), tokens.end());
    prog = make_program(tokens);
    compute_linear_scan_index(prog);
    linear_scan(prog, lsa_naive, ops);
    l = std::get<Let>(prog.expressions.front());
    TEST_EQ(2, l.live_ranges.front().first);
    TEST_EQ(5, l.live_ranges.front().last);
    TEST_EQ(3, l.live_ranges.back().first);
    TEST_EQ(5, l.live_ranges.back().last);
    }